

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_GLMClassifier_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/GLMClassifier.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  GLMClassifier_DoubleArray::GLMClassifier_DoubleArray
            ((GLMClassifier_DoubleArray *)&_GLMClassifier_DoubleArray_default_instance_);
  DAT_0074a298 = 1;
  GLMClassifier::GLMClassifier((GLMClassifier *)&_GLMClassifier_default_instance_);
  DAT_0074a2f8 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _GLMClassifier_DoubleArray_default_instance_.DefaultConstruct();
  _GLMClassifier_default_instance_.DefaultConstruct();
}